

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O3

String * __thiscall doctest::String::operator+=(String *this,String *other)

{
  char cVar1;
  char *__src;
  char *__src_00;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  size_t __size;
  
  __src = other->m_str;
  if (__src != (char *)0x0) {
    __src_00 = this->m_str;
    if (__src_00 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = __src_00 + -1;
      pcVar2 = __src_00;
      do {
        pcVar4 = pcVar4 + 1;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      } while (cVar1 != '\0');
    }
    __size = (long)pcVar4 - (long)__src_00;
    pcVar4 = __src;
    do {
      __size = __size + 1;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
    pcVar4 = (char *)malloc(__size);
    strcpy(pcVar4,__src_00);
    if (__src_00 == (char *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = __src_00 + -1;
      pcVar3 = __src_00;
      do {
        pcVar2 = pcVar2 + 1;
        cVar1 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar1 != '\0');
    }
    strcpy(pcVar4 + ((long)pcVar2 - (long)__src_00),__src);
    free(__src_00);
    this->m_str = pcVar4;
  }
  return this;
}

Assistant:

String& String::operator+=(const String& other) {
    using namespace detail;
    if(other.m_str != 0) {
        char* newStr = static_cast<char*>(malloc(my_strlen(m_str) + my_strlen(other.m_str) + 1));
        strcpy(newStr, m_str);
        strcpy(newStr + my_strlen(m_str), other.m_str);
        free(m_str);
        m_str = newStr;
    }
    return *this;
}